

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NFiles.cpp
# Opt level: O0

void __thiscall amrex::NFilesIter::SetDynamic(NFilesIter *this,int deciderproc)

{
  int iVar1;
  long lVar2;
  Long LVar3;
  int *piVar4;
  undefined4 in_ESI;
  Vector<int,_std::allocator<int>_> *in_RDI;
  vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  *unaff_retaddr;
  size_type in_stack_ffffffffffffffd8;
  Vector<int,_std::allocator<int>_> *__new_size;
  
  *(undefined4 *)
   &in_RDI[0x1d].super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = in_ESI;
  lVar2 = (long)currentDeciderIndex;
  __new_size = in_RDI;
  LVar3 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0xfa0a59);
  if ((LVar3 <= lVar2) || (currentDeciderIndex < 0)) {
    currentDeciderIndex = 0;
  }
  LVar3 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0xfa0a8a);
  if (0 < LVar3) {
    if ((*(int *)&in_RDI[0x1d].super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage < 0) ||
       (*(int *)((long)&(in_RDI->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + 4) <=
        *(int *)&in_RDI[0x1d].super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage)) {
      piVar4 = Vector<int,_std::allocator<int>_>::operator[](in_RDI,in_stack_ffffffffffffffd8);
      *(int *)&in_RDI[0x1d].super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage = *piVar4;
    }
    iVar1 = WhichSetPosition((int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                             (int)(in_stack_ffffffffffffffd8 >> 0x20),
                             SUB81(in_stack_ffffffffffffffd8 >> 0x18,0));
    if (iVar1 == 0) {
      piVar4 = Vector<int,_std::allocator<int>_>::operator[](in_RDI,in_stack_ffffffffffffffd8);
      *(int *)&in_RDI[0x1d].super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage = *piVar4;
    }
  }
  currentDeciderIndex =
       *(int *)((long)&(in_RDI->super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish + 4) + -1 + currentDeciderIndex;
  lVar2 = (long)currentDeciderIndex;
  LVar3 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0xfa0b58);
  if ((LVar3 <= lVar2) || (currentDeciderIndex < 0)) {
    currentDeciderIndex = 0;
  }
  if (*(int *)&(in_RDI->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start ==
      *(int *)&in_RDI[0x1d].super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage) {
    WhichSetPosition((int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)lVar2 >> 0x20),
                     SUB81((ulong)lVar2 >> 0x18,0));
  }
  iVar1 = ParallelDescriptor::SeqNum();
  *(int *)&in_RDI[0x1e].super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       iVar1;
  iVar1 = ParallelDescriptor::SeqNum();
  *(int *)((long)&in_RDI[0x1e].super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + 4) = iVar1;
  iVar1 = ParallelDescriptor::SeqNum();
  *(int *)&in_RDI[0x1e].super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       iVar1;
  iVar1 = ParallelDescriptor::SeqNum();
  *(int *)((long)&in_RDI[0x1e].super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish + 4) = iVar1;
  *(undefined4 *)
   ((long)&in_RDI[0x1d].super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   4) = *(undefined4 *)
         ((long)&(in_RDI->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + 4);
  *(undefined1 *)
   ((long)&in_RDI[0x1d].super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start +
   4) = 0;
  if (*(int *)&(in_RDI->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish ==
      *(int *)((long)&(in_RDI->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + 4)) {
    *(undefined1 *)
     ((long)&in_RDI[0x1d].super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
     + 4) = 1;
    iVar1 = ParallelDescriptor::IOProcessorNumber();
    *(int *)((long)&in_RDI[0x1d].super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage + 4) = iVar1;
  }
  else {
    std::
    vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
    ::clear((vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
             *)0xfa0c32);
    std::
    vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
    ::resize(unaff_retaddr,(size_type)__new_size);
  }
  return;
}

Assistant:

void NFilesIter::SetDynamic(int deciderproc)
{
  deciderProc = deciderproc;
  // ---- we have to check currentDeciderIndex here also in case of
  // ---- different nfiles for plots and checkpoints
  if(currentDeciderIndex >= availableDeciders.size() || currentDeciderIndex < 0) {
    currentDeciderIndex = 0;
  }
  if(availableDeciders.size() > 0) {
    if(deciderProc < 0 || deciderProc >= nProcs) {
      deciderProc = availableDeciders[currentDeciderIndex];
    }
    if(NFilesIter::WhichSetPosition(deciderProc, nProcs, nOutFiles, groupSets) == 0) {
      // ---- the decider cannot have set position zero
      deciderProc = availableDeciders[currentDeciderIndex];
    }
  }
  currentDeciderIndex += nSets - 1;
  if(currentDeciderIndex >= availableDeciders.size() || currentDeciderIndex < 0) {
    currentDeciderIndex = 0;
  }
  if(myProc == deciderProc) {
    NFilesIter::WhichSetPosition(myProc, nProcs, nOutFiles, groupSets);
  }

  deciderTag = ParallelDescriptor::SeqNum();
  coordinatorTag = ParallelDescriptor::SeqNum();
  doneTag = ParallelDescriptor::SeqNum();
  writeTag = ParallelDescriptor::SeqNum();
  remainingWriters = nProcs;
  useStaticSetSelection = false;
  if(nOutFiles == nProcs) {
    useStaticSetSelection = true;
    coordinatorProc = ParallelDescriptor::IOProcessorNumber();
  } else {
    fileNumbersWriteOrder.clear();
    fileNumbersWriteOrder.resize(nOutFiles);
  }
}